

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O0

int luabridge::detail::Invoke<void,luabridge::detail::TypeList<int,void>,1>::run<void(*)(int)>
              (lua_State *L,_func_void_int **fn)

{
  exception *e;
  TypeListValues<luabridge::detail::TypeList<int,_void>_> local_28;
  ArgList<luabridge::detail::TypeList<int,_void>,_1> args;
  _func_void_int **fn_local;
  lua_State *L_local;
  
  args.super_TypeListValues<luabridge::detail::TypeList<int,_void>_> =
       (TypeListValues<luabridge::detail::TypeList<int,_void>_>)fn;
  ArgList<luabridge::detail::TypeList<int,_void>,_1>::ArgList
            ((ArgList<luabridge::detail::TypeList<int,_void>,_1> *)&local_28,L);
  FuncTraits<void_(*)(int),_void_(*)(int)>::call
            ((DeclType *)args.super_TypeListValues<luabridge::detail::TypeList<int,_void>_>,
             &local_28);
  return 0;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            FuncTraits<Fn>::call(fn, args);
            return 0;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }